

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haar.cpp
# Opt level: O2

Mat * imagestego::impl::HaarWavelet::inverseVerticalLifting(Mat *src)

{
  MatExpr local_390 [96];
  HaarWavelet local_330 [96];
  MatExpr local_2d0 [352];
  MatExpr local_170 [352];
  
  cv::Mat::t();
  cv::MatExpr::operator_cast_to_Mat(local_390);
  inverseHorizontalLifting(local_330,(Mat *)local_390);
  cv::Mat::t();
  cv::MatExpr::operator_cast_to_Mat((MatExpr *)src);
  cv::MatExpr::~MatExpr(local_2d0);
  cv::Mat::~Mat((Mat *)local_330);
  cv::Mat::~Mat((Mat *)local_390);
  cv::MatExpr::~MatExpr(local_170);
  return src;
}

Assistant:

static inline cv::Mat inverseVerticalLifting(const cv::Mat& src) {
        return inverseHorizontalLifting(src.t()).t();
    }